

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O2

bool __thiscall
cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
          (cmGeneratorExpressionDAGChecker *this,cmGeneratorTarget *tgt,ForGenex genex)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  bool bVar4;
  cmGeneratorExpressionDAGChecker *pcVar5;
  char *pcVar6;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __y_02;
  basic_string_view<char,_std::char_traits<char>_> __y_03;
  basic_string_view<char,_std::char_traits<char>_> __y_04;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  string_view str;
  string_view str_00;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  size_t sStack_30;
  
  pcVar5 = Top(this);
  pcVar1 = (pcVar5->Property)._M_dataplus._M_p;
  sVar2 = (pcVar5->Property)._M_string_length;
  if (tgt == (cmGeneratorTarget *)0x0) {
    __y._M_str = "LINK_LIBRARIES";
    __y._M_len = 0xe;
    __x._M_str = pcVar1;
    __x._M_len = sVar2;
    bVar4 = std::operator==(__x,__y);
    bVar3 = true;
    if (!bVar4) {
      __y_00._M_str = "INTERFACE_LINK_LIBRARIES";
      __y_00._M_len = 0x18;
      __x_00._M_str = pcVar1;
      __x_00._M_len = sVar2;
      bVar4 = std::operator==(__x_00,__y_00);
      if (!bVar4) {
        __y_01._M_str = "INTERFACE_LINK_LIBRARIES_DIRECT";
        __y_01._M_len = 0x1f;
        __x_01._M_str = pcVar1;
        __x_01._M_len = sVar2;
        bVar4 = std::operator==(__x_01,__y_01);
        if (!bVar4) {
          __y_02._M_str = "LINK_INTERFACE_LIBRARIES";
          __y_02._M_len = 0x18;
          __x_02._M_str = pcVar1;
          __x_02._M_len = sVar2;
          bVar4 = std::operator==(__x_02,__y_02);
          if (!bVar4) {
            __y_03._M_str = "IMPORTED_LINK_INTERFACE_LIBRARIES";
            __y_03._M_len = 0x21;
            __x_03._M_str = pcVar1;
            __x_03._M_len = sVar2;
            bVar4 = std::operator==(__x_03,__y_03);
            if (!bVar4) {
              str._M_str = pcVar1;
              str._M_len = sVar2;
              bVar4 = cmHasLiteralPrefix<26ul>(str,(char (*) [26])0x6895a9);
              if (!bVar4) {
                str_00._M_str = pcVar1;
                str_00._M_len = sVar2;
                bVar3 = cmHasLiteralPrefix<35ul>
                                  (str_00,(char (*) [35])"IMPORTED_LINK_INTERFACE_LIBRARIES_");
              }
            }
          }
        }
      }
    }
    bVar4 = 1 < genex - LINK_LIBRARY;
    if (bVar4 && bVar3 == false) {
      pcVar6 = "INTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE";
      sStack_30 = 0x27;
      goto LAB_0041422e;
    }
    bVar3 = (bool)(bVar3 | bVar4);
  }
  else {
    if (pcVar5->Target == tgt) {
      pcVar6 = "LINK_LIBRARIES";
      sStack_30 = 0xe;
LAB_0041422e:
      __y_04._M_str = pcVar6;
      __y_04._M_len = sStack_30;
      __x_04._M_str = pcVar1;
      __x_04._M_len = sVar2;
      bVar4 = std::operator==(__x_04,__y_04);
      return bVar4;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries(
  cmGeneratorTarget const* tgt, ForGenex genex) const
{
  const auto* top = this->Top();

  cm::string_view prop(top->Property);

  if (tgt) {
    return top->Target == tgt && prop == "LINK_LIBRARIES"_s;
  }

  auto result = prop == "LINK_LIBRARIES"_s ||
    prop == "INTERFACE_LINK_LIBRARIES"_s ||
    prop == "INTERFACE_LINK_LIBRARIES_DIRECT"_s ||
    prop == "LINK_INTERFACE_LIBRARIES"_s ||
    prop == "IMPORTED_LINK_INTERFACE_LIBRARIES"_s ||
    cmHasLiteralPrefix(prop, "LINK_INTERFACE_LIBRARIES_") ||
    cmHasLiteralPrefix(prop, "IMPORTED_LINK_INTERFACE_LIBRARIES_");

  return genex == ForGenex::LINK_LIBRARY || genex == ForGenex::LINK_GROUP
    ? result
    : (result || prop == "INTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE"_s);
}